

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaset.c
# Opt level: O0

int slaset_slu(char *uplo,int *m,int *n,float *alpha,float *beta,float *a,int *lda)

{
  int iVar1;
  int local_50;
  int local_48;
  int local_40;
  float *a_local;
  float *beta_local;
  float *alpha_local;
  int *n_local;
  int *m_local;
  char *uplo_local;
  
  iVar1 = strncmp(uplo,"U",1);
  if (iVar1 == 0) {
    for (slaset_slu::j = 2; slaset_slu::j <= *n; slaset_slu::j = slaset_slu::j + 1) {
      slaset_slu::i = 1;
      while( true ) {
        if (slaset_slu::j + -1 < *m) {
          local_40 = slaset_slu::j + -1;
        }
        else {
          local_40 = *m;
        }
        if (local_40 < slaset_slu::i) break;
        a[slaset_slu::i + -1 + (slaset_slu::j + -1) * *lda] = *alpha;
        slaset_slu::i = slaset_slu::i + 1;
      }
    }
  }
  else {
    iVar1 = strncmp(uplo,"L",1);
    if (iVar1 == 0) {
      slaset_slu::j = 1;
      while( true ) {
        if (*m < *n) {
          local_48 = *m;
        }
        else {
          local_48 = *n;
        }
        iVar1 = slaset_slu::j;
        if (local_48 < slaset_slu::j) break;
        while (slaset_slu::i = iVar1 + 1, slaset_slu::i <= *m) {
          a[iVar1 + (slaset_slu::j + -1) * *lda] = *alpha;
          iVar1 = slaset_slu::i;
        }
        slaset_slu::j = slaset_slu::j + 1;
      }
    }
    else {
      for (slaset_slu::j = 1; slaset_slu::j <= *n; slaset_slu::j = slaset_slu::j + 1) {
        for (slaset_slu::i = 1; slaset_slu::i <= *m; slaset_slu::i = slaset_slu::i + 1) {
          a[slaset_slu::i + -1 + (slaset_slu::j + -1) * *lda] = *alpha;
        }
      }
    }
  }
  slaset_slu::i = 1;
  while( true ) {
    if (*m < *n) {
      local_50 = *m;
    }
    else {
      local_50 = *n;
    }
    if (local_50 < slaset_slu::i) break;
    a[slaset_slu::i + -1 + (slaset_slu::i + -1) * *lda] = *beta;
    slaset_slu::i = slaset_slu::i + 1;
  }
  return 0;
}

Assistant:

int slaset_slu(char *uplo, int *m, int *n, float *alpha,
	float *beta, float *a, int *lda)
{
/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       October 31, 1992   


    Purpose   
    =======   

    SLASET initializes an m-by-n matrix A to BETA on the diagonal and   
    ALPHA on the offdiagonals.   

    Arguments   
    =========   

    UPLO    (input) CHARACTER*1   
            Specifies the part of the matrix A to be set.   
            = 'U':      Upper triangular part is set; the strictly lower 
  
                        triangular part of A is not changed.   
            = 'L':      Lower triangular part is set; the strictly upper 
  
                        triangular part of A is not changed.   
            Otherwise:  All of the matrix A is set.   

    M       (input) INTEGER   
            The number of rows of the matrix A.  M >= 0.   

    N       (input) INTEGER   
            The number of columns of the matrix A.  N >= 0.   

    ALPHA   (input) REAL   
            The constant to which the offdiagonal elements are to be set. 
  

    BETA    (input) REAL   
            The constant to which the diagonal elements are to be set.   

    A       (input/output) REAL array, dimension (LDA,N)   
            On exit, the leading m-by-n submatrix of A is set as follows: 
  

            if UPLO = 'U', A(i,j) = ALPHA, 1<=i<=j-1, 1<=j<=n,   
            if UPLO = 'L', A(i,j) = ALPHA, j+1<=i<=m, 1<=j<=n,   
            otherwise,     A(i,j) = ALPHA, 1<=i<=m, 1<=j<=n, i.ne.j,   

            and, for all UPLO, A(i,i) = BETA, 1<=i<=min(m,n).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= max(1,M).   

   ===================================================================== 
  


    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    /* Local variables */
    static int i, j;


#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    if (strncmp(uplo, "U", 1)==0) {

/*        Set the strictly upper triangular or trapezoidal part of the
   
          array to ALPHA. */

	for (j = 2; j <= *n; ++j) {
/* Computing MIN */
	    for (i = 1; i <= SUPERLU_MIN(j-1,*m); ++i) {
		A(i,j) = *alpha;
/* L10: */
	    }
/* L20: */
	}

    } else if (strncmp(uplo, "L", 1)==0) {

/*        Set the strictly lower triangular or trapezoidal part of the
   
          array to ALPHA. */

	for (j = 1; j <= SUPERLU_MIN(*m,*n); ++j) {
	    for (i = j + 1; i <= *m; ++i) {
		A(i,j) = *alpha;
/* L30: */
	    }
/* L40: */
	}

    } else {

/*        Set the leading m-by-n submatrix to ALPHA. */

	for (j = 1; j <= *n; ++j) {
	    for (i = 1; i <= *m; ++i) {
		A(i,j) = *alpha;
/* L50: */
	    }
/* L60: */
	}
    }

/*     Set the first SUPERLU_MIN(M,N) diagonal elements to BETA. */

    for (i = 1; i <= SUPERLU_MIN(*m,*n); ++i) {
	A(i,i) = *beta;
/* L70: */
    }

    return 0;

/*     End of SLASET */

}